

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

string * __thiscall
wabt::Decompiler::Decompile_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this)

{
  ulong *puVar1;
  Enum EVar2;
  Module *pMVar3;
  Memory *args;
  pointer ppGVar4;
  Global *args_00;
  Table *args_01;
  DataSegment *pDVar5;
  Func *f;
  pointer pTVar6;
  size_type sVar7;
  LoadStoreTracking *this_00;
  char cVar8;
  bool bVar9;
  char cVar10;
  long *plVar11;
  int iVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  char *args_1_00;
  ulong uVar13;
  char **ppcVar14;
  char **ppcVar15;
  Index IVar16;
  char (*args_2) [2];
  char cVar17;
  ulong uVar18;
  uint uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stat;
  pointer ppMVar20;
  pointer ppGVar21;
  pointer ppTVar22;
  Type TVar23;
  Decompiler *pDVar24;
  _Alloc_hider _Var25;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string __str;
  string __str_1;
  string ds;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  string local_180;
  Decompiler *local_160;
  Type local_158;
  string local_150;
  Index local_12c;
  LoadStoreTracking *local_128;
  undefined1 local_120 [200];
  string *local_58;
  _Base_ptr local_50;
  Func **local_48;
  pointer local_40;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pMVar3 = (this->mc).module;
  ppMVar20 = (pMVar3->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  TVar23 = (Type)(pMVar3->memories).
                 super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  local_160 = this;
  if ((Type)ppMVar20 != TVar23) {
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_158 = TVar23;
    do {
      args = *ppMVar20;
      IVar16 = (Index)args_1;
      name._M_str = (args->name)._M_dataplus._M_p;
      name._M_len = (args->name)._M_string_length;
      bVar9 = CheckImportExport(local_160,__return_storage_ptr__,Memory,IVar16,name);
      cat<char[8],std::__cxx11::string>
                ((string *)local_120,(wabt *)"memory ",(char (*) [8])args,args_1);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_120._0_8_);
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      if (!bVar9) {
        uVar18 = (args->page_limits).initial;
        cVar17 = '\x01';
        cVar10 = '\x01';
        if (9 < uVar18) {
          uVar13 = uVar18;
          cVar8 = '\x04';
          do {
            cVar10 = cVar8;
            if (uVar13 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_0015708b;
            }
            if (uVar13 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_0015708b;
            }
            if (uVar13 < 10000) goto LAB_0015708b;
            bVar9 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar8 = cVar10 + '\x04';
          } while (bVar9);
          cVar10 = cVar10 + '\x01';
        }
LAB_0015708b:
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_180,cVar10);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_180._M_dataplus._M_p,(uint)local_180._M_string_length,uVar18);
        uVar18 = (args->page_limits).max;
        if (9 < uVar18) {
          uVar13 = uVar18;
          cVar10 = '\x04';
          do {
            cVar17 = cVar10;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_00157112;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_00157112;
            }
            if (uVar13 < 10000) goto LAB_00157112;
            bVar9 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar10 = cVar17 + '\x04';
          } while (bVar9);
          cVar17 = cVar17 + '\x01';
        }
LAB_00157112:
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_150,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar18);
        cat<char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                  ((string *)local_120,(wabt *)"(initial: ",(char (*) [11])&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                   (char (*) [8])&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1dad78,
                   (char (*) [2])CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_120._0_8_);
        if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
          operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
        }
        TVar23 = local_158;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,
                          CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                   local_150.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(IVar16 + 1);
      ppMVar20 = ppMVar20 + 1;
    } while ((Type)ppMVar20 != TVar23);
  }
  pDVar24 = local_160;
  pMVar3 = (local_160->mc).module;
  if ((pMVar3->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (pMVar3->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pMVar3 = (pDVar24->mc).module;
  ppGVar21 = (pMVar3->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppGVar4 = (pMVar3->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar21 != ppGVar4) {
    IVar16 = 0;
    do {
      args_00 = *ppGVar21;
      ppcVar14 = (char **)(args_00->name)._M_dataplus._M_p;
      name_00._M_str = (char *)ppcVar14;
      name_00._M_len = (args_00->name)._M_string_length;
      bVar9 = CheckImportExport(local_160,__return_storage_ptr__,Global,IVar16,name_00);
      EVar2 = (args_00->type).enum_;
      local_180._M_dataplus._M_p = "byte";
      switch(EVar2) {
      case I8U:
        local_180._M_dataplus._M_p = "ubyte";
        break;
      case I16U:
        local_180._M_dataplus._M_p = "ushort";
        break;
      case I32U:
        local_180._M_dataplus._M_p = "uint";
        break;
      case ExternRef:
        local_180._M_dataplus._M_p = "externref";
        break;
      case FuncRef:
        local_180._M_dataplus._M_p = "funcref";
        break;
      case 0xfffffff1:
      case 0xfffffff2:
      case 0xfffffff3:
      case FuncRef|I8U:
      case 0xfffffff5:
      case FuncRef|I16U:
      case FuncRef|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case ~F32:
      case ~F64:
      case ~I8:
switchD_00157277_caseD_fffffff1:
        local_180._M_dataplus._M_p = "ILLEGAL";
        break;
      case I16:
        local_180._M_dataplus._M_p = "short";
        break;
      case I8:
        break;
      case V128:
        local_180._M_dataplus._M_p = "simd";
        break;
      case F64:
        local_180._M_dataplus._M_p = "double";
        break;
      case F32:
        local_180._M_dataplus._M_p = "float";
        break;
      case I64:
        local_180._M_dataplus._M_p = "long";
        break;
      case I32:
        local_180._M_dataplus._M_p = "int";
        break;
      default:
        if (EVar2 == Void) {
          local_180._M_dataplus._M_p = "void";
        }
        else {
          if (EVar2 != Func) goto switchD_00157277_caseD_fffffff1;
          local_180._M_dataplus._M_p = "func";
        }
      }
      args_1_00 = ":";
      cat<char[8],std::__cxx11::string,char[2],char_const*>
                ((string *)local_120,(wabt *)"global ",(char (*) [8])args_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
                 (char (*) [2])&local_180,ppcVar14);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_120._0_8_);
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      if (!bVar9) {
        InitExp_abi_cxx11_(&local_180,local_160,&args_00->init_expr);
        cat<char[4],std::__cxx11::string>
                  ((string *)local_120,(wabt *)0x1e3839,(char (*) [4])&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1_00);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_120._0_8_);
        if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
          operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      IVar16 = IVar16 + 1;
      ppGVar21 = ppGVar21 + 1;
    } while (ppGVar21 != ppGVar4);
  }
  pDVar24 = local_160;
  pMVar3 = (local_160->mc).module;
  if ((pMVar3->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar3->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pMVar3 = (pDVar24->mc).module;
  ppTVar22 = (pMVar3->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_158 = (Type)(pMVar3->tables).
                    super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
  if ((Type)ppTVar22 != local_158) {
    IVar16 = 0;
    do {
      args_01 = *ppTVar22;
      ppcVar14 = (char **)(args_01->name)._M_dataplus._M_p;
      name_01._M_str = (char *)ppcVar14;
      name_01._M_len = (args_01->name)._M_string_length;
      bVar9 = CheckImportExport(pDVar24,__return_storage_ptr__,Table,IVar16,name_01);
      EVar2 = (args_01->elem_type).enum_;
      local_180._M_dataplus._M_p = "byte";
      switch(EVar2) {
      case I8U:
        local_180._M_dataplus._M_p = "ubyte";
        break;
      case I16U:
        local_180._M_dataplus._M_p = "ushort";
        break;
      case I32U:
        local_180._M_dataplus._M_p = "uint";
        break;
      case ExternRef:
        local_180._M_dataplus._M_p = "externref";
        break;
      case FuncRef:
        local_180._M_dataplus._M_p = "funcref";
        break;
      case 0xfffffff1:
      case 0xfffffff2:
      case 0xfffffff3:
      case FuncRef|I8U:
      case 0xfffffff5:
      case FuncRef|I16U:
      case FuncRef|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case ~F32:
      case ~F64:
      case ~I8:
switchD_00157477_caseD_fffffff1:
        local_180._M_dataplus._M_p = "ILLEGAL";
        break;
      case I16:
        local_180._M_dataplus._M_p = "short";
        break;
      case I8:
        break;
      case V128:
        local_180._M_dataplus._M_p = "simd";
        break;
      case F64:
        local_180._M_dataplus._M_p = "double";
        break;
      case F32:
        local_180._M_dataplus._M_p = "float";
        break;
      case I64:
        local_180._M_dataplus._M_p = "long";
        break;
      case I32:
        local_180._M_dataplus._M_p = "int";
        break;
      default:
        if (EVar2 == Void) {
          local_180._M_dataplus._M_p = "void";
        }
        else {
          if (EVar2 != Func) goto switchD_00157477_caseD_fffffff1;
          local_180._M_dataplus._M_p = "func";
        }
      }
      cat<char[7],std::__cxx11::string,char[2],char_const*>
                ((string *)local_120,(wabt *)"table ",(char (*) [7])args_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
                 (char (*) [2])&local_180,ppcVar14);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_120._0_8_);
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      if (!bVar9) {
        uVar18 = (args_01->elem_limits).initial;
        cVar17 = '\x01';
        cVar10 = '\x01';
        if (9 < uVar18) {
          uVar13 = uVar18;
          cVar8 = '\x04';
          do {
            cVar10 = cVar8;
            if (uVar13 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_001575c0;
            }
            if (uVar13 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_001575c0;
            }
            if (uVar13 < 10000) goto LAB_001575c0;
            bVar9 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar8 = cVar10 + '\x04';
          } while (bVar9);
          cVar10 = cVar10 + '\x01';
        }
LAB_001575c0:
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_180,cVar10);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_180._M_dataplus._M_p,(uint)local_180._M_string_length,uVar18);
        uVar18 = (args_01->elem_limits).max;
        if (9 < uVar18) {
          uVar13 = uVar18;
          cVar10 = '\x04';
          do {
            cVar17 = cVar10;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_00157648;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_00157648;
            }
            if (uVar13 < 10000) goto LAB_00157648;
            bVar9 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar10 = cVar17 + '\x04';
          } while (bVar9);
          cVar17 = cVar17 + '\x01';
        }
LAB_00157648:
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_150,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar18);
        cat<char[7],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                  ((string *)local_120,(wabt *)"(min: ",(char (*) [7])&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                   (char (*) [8])&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1dad78,
                   (char (*) [2])CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_120._0_8_);
        if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
          operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
        }
        pDVar24 = local_160;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,
                          CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                   local_150.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      IVar16 = IVar16 + 1;
      ppTVar22 = ppTVar22 + 1;
    } while ((Type)ppTVar22 != local_158);
  }
  pMVar3 = (pDVar24->mc).module;
  if ((pMVar3->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar3->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pMVar3 = (pDVar24->mc).module;
  TVar23 = (Type)(pMVar3->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  local_158 = *(Type *)&(pMVar3->data_segments).
                        super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
  if (TVar23 != local_158) {
    do {
      pDVar5 = *(DataSegment **)TVar23;
      InitExp_abi_cxx11_(&local_180,local_160,&pDVar5->offset);
      cat<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[4]>
                ((string *)local_120,(wabt *)"data ",(char (*) [6])&pDVar5->name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(offset: ",
                 (char (*) [10])&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") =",
                 (char (*) [4])CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_120._0_8_);
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      BinaryToString_abi_cxx11_((string *)local_120,local_160,&pDVar5->data);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_120._0_8_);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      TVar23 = (Type)((long)TVar23 + 8);
    } while (TVar23 != local_158);
  }
  pDVar24 = local_160;
  pMVar3 = (local_160->mc).module;
  if ((pMVar3->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar3->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pMVar3 = (pDVar24->mc).module;
  local_38 = (pMVar3->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_40 = (pMVar3->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (local_38 != local_40) {
    local_48 = &pDVar24->cur_func;
    local_128 = &pDVar24->lst;
    local_50 = &(pDVar24->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header;
    IVar16 = 0;
    local_58 = __return_storage_ptr__;
    do {
      f = *local_38;
      pDVar24->cur_func = f;
      args_2 = (char (*) [2])(f->name)._M_string_length;
      name_02._M_str = (f->name)._M_dataplus._M_p;
      name_02._M_len = (size_t)args_2;
      local_12c = IVar16;
      cVar10 = CheckImportExport(pDVar24,__return_storage_ptr__,First,IVar16,name_02);
      AST::AST((AST *)local_120,&pDVar24->mc,f);
      pDVar24->cur_ast = (AST *)local_120;
      if (!(bool)cVar10) {
        args_2 = (char (*) [2])0x1;
        AST::Construct((AST *)local_120,&f->exprs,
                       (Index)((ulong)((long)(f->decl).sig.result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(f->decl).sig.result_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3),0,true)
        ;
        this_00 = local_128;
        LoadStoreTracking::Track(local_128,(Node *)local_120._8_8_);
        LoadStoreTracking::CheckLayouts(this_00);
      }
      cat<char[10],std::__cxx11::string,char[2]>
                (&local_180,(wabt *)"function ",(char (*) [10])f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e3e24,
                 args_2);
      __return_storage_ptr__ = local_58;
      std::__cxx11::string::_M_append((char *)local_58,(ulong)local_180._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if (((long)(f->decl).sig.param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(f->decl).sig.param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x7fffffff8U) != 0) {
        uVar18 = 0;
        do {
          if (uVar18 != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          local_158 = (f->decl).sig.param_types.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar18];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          local_150._M_string_length = 0;
          local_150.field_2._M_local_buf[0] = '\0';
          uVar13 = uVar18 & 0xffffffff;
          do {
            uVar19 = (uint)uVar13;
            std::__cxx11::string::push_back((char)&local_150);
            uVar13 = (ulong)((int)(uVar13 / 0x1a) - 1);
          } while (0x19 < uVar19);
          plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x1ced01);
          pDVar24 = local_160;
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          puVar1 = (ulong *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar1) {
            local_180.field_2._M_allocated_capacity = *puVar1;
            local_180.field_2._8_8_ = plVar11[3];
          }
          else {
            local_180.field_2._M_allocated_capacity = *puVar1;
            local_180._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_180._M_string_length = plVar11[1];
          *plVar11 = (long)puVar1;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,
                            CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                     local_150.field_2._M_local_buf[0]) + 1);
          }
          LocalDecl(&local_150,pDVar24,&local_180,local_158);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_150._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,
                            CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                     local_150.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < ((ulong)((long)(f->decl).sig.param_types.
                                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(f->decl).sig.param_types.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff)
                );
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pTVar6 = (f->decl).sig.result_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar12 = (int)((ulong)((long)(f->decl).sig.result_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar6) >> 3);
      if (iVar12 != 0) {
        if (iVar12 == 1) {
          EVar2 = pTVar6->enum_;
          ppcVar14 = (char **)(ulong)(uint)(EVar2 + 0x11);
          if ((uint)(EVar2 + 0x11) < 0x19) {
            ppcVar15 = (char **)((long)&switchD_00157bd3::switchdataD_001d83d8 +
                                (long)(int)(&switchD_00157bd3::switchdataD_001d83d8)[(long)ppcVar14]
                                );
            local_150._M_dataplus._M_p = "byte";
            switch(ppcVar14) {
            case (char **)0x0:
              local_150._M_dataplus._M_p = "externref";
              break;
            case (char **)0x1:
              local_150._M_dataplus._M_p = "funcref";
              break;
            default:
switchD_00157bd3_caseD_fffffff1:
              local_150._M_dataplus._M_p = "ILLEGAL";
              break;
            case (char **)0xa:
              local_150._M_dataplus._M_p = "short";
              break;
            case (char **)0xb:
              break;
            case (char **)0xc:
              local_150._M_dataplus._M_p = "simd";
              break;
            case (char **)0xd:
              local_150._M_dataplus._M_p = "double";
              break;
            case (char **)0xe:
              local_150._M_dataplus._M_p = "float";
              break;
            case (char **)0xf:
              local_150._M_dataplus._M_p = "long";
              break;
            case (char **)0x10:
              local_150._M_dataplus._M_p = "int";
              break;
            case (char **)0x15:
              local_150._M_dataplus._M_p = "ubyte";
              break;
            case (char **)0x17:
              local_150._M_dataplus._M_p = "ushort";
              break;
            case (char **)0x18:
              local_150._M_dataplus._M_p = "uint";
            }
          }
          else {
            ppcVar15 = ppcVar14;
            if (EVar2 == Void) {
              local_150._M_dataplus._M_p = "void";
            }
            else {
              if (EVar2 != Func) goto switchD_00157bd3_caseD_fffffff1;
              local_150._M_dataplus._M_p = "func";
            }
          }
          cat<char[2],char_const*>(&local_180,(wabt *)":",(char (*) [2])&local_150,ppcVar15);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_180._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          if (((long)(f->decl).sig.result_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(f->decl).sig.result_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start & 0x7fffffff8U) != 0) {
            uVar18 = 0;
            do {
              if (uVar18 != 0) {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              EVar2 = (f->decl).sig.result_types.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar18].enum_;
              switch(EVar2) {
              case I8U:
                break;
              case I16U:
                break;
              case I32U:
                break;
              case ExternRef:
                break;
              case FuncRef:
                break;
              case 0xfffffff1:
              case 0xfffffff2:
              case 0xfffffff3:
              case FuncRef|I8U:
              case 0xfffffff5:
              case FuncRef|I16U:
              case FuncRef|I32U:
              case ~I32U:
              case Any:
              case ~I64:
              case ~F32:
              case ~F64:
              case ~I8:
switchD_00157c50_caseD_fffffff1:
                break;
              case I16:
                break;
              case I8:
                break;
              case V128:
                break;
              case F64:
                break;
              case F32:
                break;
              case I64:
                break;
              case I32:
                break;
              default:
                if ((EVar2 != Void) && (EVar2 != Func)) goto switchD_00157c50_caseD_fffffff1;
              }
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              uVar18 = uVar18 + 1;
            } while (uVar18 < ((ulong)((long)(f->decl).sig.result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(f->decl).sig.result_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3 &
                              0xffffffff));
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      if (cVar10 == '\0') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        DecompileExpr((Value *)&local_180,pDVar24,(Node *)local_120._8_8_,(Node *)0x0);
        IndentValue(pDVar24,(Value *)&local_180,pDVar24->indent_amount,(string_view)ZEXT816(0));
        sVar7 = local_180._M_string_length;
        for (_Var25._M_p = local_180._M_dataplus._M_p; _Var25._M_p != (pointer)sVar7;
            _Var25._M_p = _Var25._M_p + 0x20) {
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)_Var25._M_p);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_180);
        pDVar24 = local_160;
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      ModuleContext::EndFunc(&pDVar24->mc);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
                  *)local_128,
                 (_Link_type)
                 (pDVar24->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      (pDVar24->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pDVar24->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_50;
      (pDVar24->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_50;
      (pDVar24->lst).vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      IVar16 = local_12c + 1;
      *local_48 = (Func *)0x0;
      local_48[1] = (Func *)0x0;
      AST::~AST((AST *)local_120);
      local_38 = local_38 + 1;
    } while (local_38 != local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Decompile() {
    std::string s;
    // Memories.
    Index memory_index = 0;
    for (auto m : mc.module.memories) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Memory, memory_index, m->name);
      s += cat("memory ", m->name);
      if (!is_import) {
        s += cat("(initial: ", std::to_string(m->page_limits.initial),
                 ", max: ", std::to_string(m->page_limits.max), ")");
      }
      s += ";\n";
      memory_index++;
    }
    if (!mc.module.memories.empty())
      s += "\n";

    // Globals.
    Index global_index = 0;
    for (auto g : mc.module.globals) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Global, global_index, g->name);
      s += cat("global ", g->name, ":", GetDecompTypeName(g->type));
      if (!is_import) {
        s += cat(" = ", InitExp(g->init_expr));
      }
      s += ";\n";
      global_index++;
    }
    if (!mc.module.globals.empty())
      s += "\n";

    // Tables.
    Index table_index = 0;
    for (auto tab : mc.module.tables) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Table, table_index, tab->name);
      s += cat("table ", tab->name, ":", GetDecompTypeName(tab->elem_type));
      if (!is_import) {
        s += cat("(min: ", std::to_string(tab->elem_limits.initial),
                 ", max: ", std::to_string(tab->elem_limits.max), ")");
      }
      s += ";\n";
      table_index++;
    }
    if (!mc.module.tables.empty())
      s += "\n";

    // Data.
    for (auto dat : mc.module.data_segments) {
      s += cat("data ", dat->name, "(offset: ", InitExp(dat->offset), ") =");
      auto ds = BinaryToString(dat->data);
      if (ds.size() > target_exp_width / 2) {
        s += "\n";
      } else {
        s += " ";
      }
      s += ds;
      s += ";\n";
    }
    if (!mc.module.data_segments.empty())
      s += "\n";

    // Code.
    Index func_index = 0;
    for (auto f : mc.module.funcs) {
      cur_func = f;
      auto is_import =
          CheckImportExport(s, ExternalKind::Func, func_index, f->name);
      AST ast(mc, f);
      cur_ast = &ast;
      if (!is_import) {
        ast.Construct(f->exprs, f->GetNumResults(), 0, true);
        lst.Track(ast.exp_stack[0]);
        lst.CheckLayouts();
      }
      s += cat("function ", f->name, "(");
      for (Index i = 0; i < f->GetNumParams(); i++) {
        if (i)
          s += ", ";
        auto t = f->GetParamType(i);
        auto name = "$" + IndexToAlphaName(i);
        s += LocalDecl(name, t);
      }
      s += ")";
      if (f->GetNumResults()) {
        if (f->GetNumResults() == 1) {
          s += cat(":", GetDecompTypeName(f->GetResultType(0)));
        } else {
          s += ":(";
          for (Index i = 0; i < f->GetNumResults(); i++) {
            if (i)
              s += ", ";
            s += GetDecompTypeName(f->GetResultType(i));
          }
          s += ")";
        }
      }
      if (is_import) {
        s += ";";
      } else {
        s += " {\n";
        auto val = DecompileExpr(ast.exp_stack[0], nullptr);
        IndentValue(val, indent_amount, {});
        for (auto& stat : val.v) {
          s += stat;
          s += "\n";
        }
        s += "}";
      }
      s += "\n\n";
      mc.EndFunc();
      lst.Clear();
      func_index++;
      cur_ast = nullptr;
      cur_func = nullptr;
    }
    return s;
  }